

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O3

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt32 value)

{
  uint uVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  deUint8 adVar4 [4];
  long lVar5;
  uint uVar6;
  deUint8 data [4];
  
  adVar4 = (deUint8  [4])(value ^ 0x3298d15);
  data[0] = adVar4[0];
  data[1] = adVar4[1];
  data[2] = adVar4[2];
  data[3] = adVar4[3];
  uVar2 = builder->m_hash;
  lVar3 = 0;
  do {
    uVar2 = uVar2 ^ data[lVar3];
    lVar5 = 8;
    do {
      uVar6 = uVar2 >> 1;
      uVar1 = uVar2 & 1;
      uVar2 = uVar6 ^ 0x4c11db7;
      if (uVar1 == 0) {
        uVar2 = uVar6;
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  builder->m_hash = uVar2;
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt32 value)
{
	const deInt32	val		= value ^ 53054741;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint32)val) & 0xFFu),
		(deUint8)((((deUint32)val) >> 8) & 0xFFu),
		(deUint8)((((deUint32)val) >> 16) & 0xFFu),
		(deUint8)((((deUint32)val) >> 24) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}